

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_writepage(LispPTR *args)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  __off_t _Var4;
  ssize_t sVar5;
  uint uVar6;
  uint uVar7;
  DLword *page;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    uVar6 = args[4];
    if ((uVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
    }
    Lisp_errno = (int *)(Lisp_world + uVar6);
    uVar6 = *args;
    if ((uVar6 & 0xfff0000) == 0xf0000) {
      uVar6 = uVar6 | 0xffff0000;
    }
    else if ((uVar6 & 0xfff0000) == 0xe0000) {
      uVar6 = uVar6 & 0xffff;
    }
    else {
      if ((uVar6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
      }
      uVar6 = *(uint *)(Lisp_world + uVar6);
    }
    uVar7 = args[1];
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      uVar7 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      uVar7 = uVar7 & 0xffff;
    }
    else {
      if ((uVar7 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
      }
      uVar7 = *(uint *)(Lisp_world + uVar7);
    }
    uVar2 = args[3];
    page = Lisp_world + args[2];
    if ((uVar2 & 0xfff0000) == 0xf0000) {
      uVar2 = uVar2 | 0xffff0000;
    }
    else if ((uVar2 & 0xfff0000) == 0xe0000) {
      uVar2 = uVar2 & 0xffff;
    }
    else {
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      uVar2 = *(uint *)(Lisp_world + uVar2);
    }
    do {
      alarm(TIMEOUT_TIME);
      piVar3 = __errno_location();
      do {
        *piVar3 = 0;
        _Var4 = lseek(uVar6,(long)(int)(uVar7 << 9),0);
        if (_Var4 != -1) {
          alarm(0);
          uVar7 = (int)(uVar2 + 3) >> 2;
          word_swap_page(page,uVar7);
          do {
            alarm(TIMEOUT_TIME);
            do {
              *piVar3 = 0;
              sVar5 = write(uVar6,page,(long)(int)uVar2);
              if (sVar5 != -1) {
                alarm(0);
                word_swap_page(page,uVar7);
                return 0x4c;
              }
            } while (*piVar3 == 4);
            alarm(0);
          } while (*piVar3 == 4);
          *Lisp_errno = *piVar3;
          word_swap_page(page,uVar7);
          return 0;
        }
      } while (*piVar3 == 4);
      alarm(0);
    } while (*piVar3 == 4);
    *Lisp_errno = *piVar3;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_writepage(LispPTR *args)
{
  int fd;
  int npage;
  char *bufp;
  int count;
  ssize_t rval;
  off_t offval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);
  count = LispNumToCInt(args[3]);

sklp2:
  TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
  if (offval == -1) {
    if (errno == EINTR) goto sklp2; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

/* OK to write the page. */

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

wlp:
  TIMEOUT(rval = write(fd, bufp, count));
  if (rval == -1) {
    if (errno == EINTR) goto wlp; /* interrupted; retry */
    *Lisp_errno = errno;
#ifdef BYTESWAP
    word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */
    return (NIL);
  }

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

  return (ATOM_T);
}